

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

CURLcode curl_mime_data(curl_mimepart *part,char *data,size_t datasize)

{
  char *__dest;
  CURLcode CVar1;
  
  if (part == (curl_mimepart *)0x0) {
    CVar1 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    cleanup_part_content(part);
    CVar1 = CURLE_OK;
    if (data != (char *)0x0) {
      if (datasize == 0xffffffffffffffff) {
        datasize = strlen(data);
      }
      __dest = (char *)(*Curl_cmalloc)(datasize + 1);
      part->data = __dest;
      if (__dest == (char *)0x0) {
        CVar1 = CURLE_OUT_OF_MEMORY;
      }
      else {
        part->datasize = datasize;
        if (datasize != 0) {
          memcpy(__dest,data,datasize);
          __dest = part->data;
        }
        __dest[datasize] = '\0';
        part->readfunc = mime_mem_read;
        part->seekfunc = mime_mem_seek;
        part->freefunc = mime_mem_free;
        *(byte *)&part->flags = (byte)part->flags | 4;
        part->kind = MIMEKIND_DATA;
      }
    }
  }
  return CVar1;
}

Assistant:

CURLcode curl_mime_data(curl_mimepart *part,
                        const char *data, size_t datasize)
{
  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  cleanup_part_content(part);

  if(data) {
    if(datasize == CURL_ZERO_TERMINATED)
      datasize = strlen(data);

    part->data = malloc(datasize + 1);
    if(!part->data)
      return CURLE_OUT_OF_MEMORY;

    part->datasize = datasize;

    if(datasize)
      memcpy(part->data, data, datasize);
    part->data[datasize] = '\0';    /* Set a null terminator as sentinel. */

    part->readfunc = mime_mem_read;
    part->seekfunc = mime_mem_seek;
    part->freefunc = mime_mem_free;
    part->flags |= MIME_FAST_READ;
    part->kind = MIMEKIND_DATA;
  }

  return CURLE_OK;
}